

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneST.cpp
# Opt level: O0

uint __thiscall PermutazioneST::numeroInversioni(PermutazioneST *this,PermutazioneST *p)

{
  ushort local_20;
  ushort local_1e;
  uint local_1c;
  unsigned_short j;
  unsigned_short i;
  uint inv;
  PermutazioneST *p_local;
  PermutazioneST *this_local;
  
  local_1c = 0;
  for (local_1e = 0; local_20 = local_1e,
      (int)(uint)local_1e < (int)((p->super_Permutazione).dimensione - 1); local_1e = local_1e + 1)
  {
    while (local_20 = local_20 + 1, local_20 < (p->super_Permutazione).dimensione) {
      if ((p->super_Permutazione).individuo[local_20] < (p->super_Permutazione).individuo[local_1e])
      {
        local_1c = local_1c + 1;
      }
    }
  }
  return local_1c;
}

Assistant:

unsigned int PermutazioneST::numeroInversioni(PermutazioneST& p) {

	unsigned int inv = 0;

	for (unsigned short i = 0; i < p.dimensione - 1; i++) {
		for (unsigned short j = i + 1; j < p.dimensione; j++) {
			if (p.individuo[i] > p.individuo[j])
				inv++;
		}
	}

	return inv;
}